

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmNinjaDeps *this_00;
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> _Var1;
  pointer puVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  cmake *pcVar5;
  ostream *os_00;
  bool bVar6;
  byte bVar7;
  int iVar8;
  string *psVar9;
  string *__x;
  mapped_type *pmVar10;
  ostream *poVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *fi;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar12;
  string_view source;
  string_view source_00;
  string_view source_01;
  string verifyStampFile;
  string verifyScriptFile;
  cmNinjaBuild vgBuild;
  cmNinjaRule rule;
  cmNinjaBuild reBuild;
  string local_548;
  string local_528;
  cmAlphaNum local_508;
  pointer local_4d8;
  ostream *local_4d0;
  string local_4c8;
  cmNinjaBuild local_4a8;
  undefined1 local_388 [64];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_348 [32];
  char local_328 [192];
  bool local_268;
  cmNinjaBuild local_210;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&local_210);
  bVar6 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  if (bVar6) {
    return;
  }
  puVar12 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"RERUN_CMAKE",(allocator<char> *)&local_210);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_388,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  CMakeCmd_abi_cxx11_(&local_548,this);
  local_210.Comment._M_dataplus._M_p = (pointer)local_548._M_string_length;
  local_210.Comment._M_string_length = (size_type)local_548._M_dataplus._M_p;
  local_4a8.Comment._M_dataplus._M_p = (pointer)0x1d;
  local_4a8.Comment._M_string_length = 0x6418cc;
  _Var1._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
  super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
       (puVar12->_M_t).
       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
  psVar9 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                     ((cmLocalGenerator *)
                      _Var1._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  source._M_str = (psVar9->_M_dataplus)._M_p;
  source._M_len = psVar9->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_528,
             (cmOutputConverter *)
             ((long)_Var1._M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8),source,SHELL
            );
  _Var1._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
  super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
       (puVar12->_M_t).
       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
  psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)
                      _Var1._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  source_00._M_str = (psVar9->_M_dataplus)._M_p;
  source_00._M_len = psVar9->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_4c8,
             (cmOutputConverter *)
             ((long)_Var1._M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8),source_00,
             SHELL);
  cmStrCat<std::__cxx11::string,char[4],std::__cxx11::string>
            ((string *)&local_508,(cmAlphaNum *)&local_210,(cmAlphaNum *)&local_4a8,&local_528,
             (char (*) [4])0x629388,&local_4c8);
  std::__cxx11::string::operator=((string *)(local_388 + 0x20),(string *)&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::assign((char *)local_348);
  std::__cxx11::string::assign(local_328);
  local_268 = true;
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_388);
  local_4d8 = puVar12;
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"RERUN_CMAKE",(allocator<char> *)local_388);
  local_4d0 = os;
  cmNinjaBuild::cmNinjaBuild(&local_210,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::assign((char *)&local_210);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x47])
            (this,&local_210.Outputs);
  puVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &local_210.ImplicitDeps;
  for (puVar12 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                 super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2; puVar12 = puVar12 + 1
      ) {
    pcVar3 = ((puVar12->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
              super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
              super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
    pbVar4 = (pcVar3->ListFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar9 = *(string **)
                   &(pcVar3->ListFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl; psVar9 != pbVar4; psVar9 = psVar9 + 1) {
      __x = ConvertToNinjaPath(this,psVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,__x);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&this->CMakeCacheFile);
  iVar8 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x40])(this);
  os_00 = local_4d0;
  if ((char)iVar8 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_388,"pool",(allocator<char> *)&local_4a8);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_210.Variables,(key_type *)local_388);
    std::__cxx11::string::assign((char *)pmVar10);
    std::__cxx11::string::~string((string *)local_388);
  }
  pcVar5 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  bVar7 = this->NinjaSupportsManifestRestat;
  if ((bool)bVar7 == true) {
    bVar6 = cmake::DoWriteGlobVerifyTarget(pcVar5);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"VERIFY_GLOBS",(allocator<char> *)&local_4a8);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_388,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      CMakeCmd_abi_cxx11_(&local_528,this);
      local_4a8.Comment._M_dataplus._M_p = (pointer)local_528._M_string_length;
      local_4a8.Comment._M_string_length = (size_type)local_528._M_dataplus._M_p;
      local_508.View_._M_len = 4;
      local_508.View_._M_str = " -P ";
      _Var1._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
      super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
           (local_4d8->_M_t).
           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
      psVar9 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar5);
      source_01._M_str = (psVar9->_M_dataplus)._M_p;
      source_01._M_len = psVar9->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_4c8,
                 (cmOutputConverter *)
                 ((long)_Var1._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8),
                 source_01,SHELL);
      cmStrCat<std::__cxx11::string>(&local_548,(cmAlphaNum *)&local_4a8,&local_508,&local_4c8);
      std::__cxx11::string::operator=((string *)(local_388 + 0x20),(string *)&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::assign((char *)local_348);
      std::__cxx11::string::assign(local_328);
      local_268 = true;
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)local_388);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_388);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"phony",(allocator<char> *)&local_4a8);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_388,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::assign((char *)local_388);
      psVar9 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar5);
      local_4a8.Comment._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
      local_4a8.Comment._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
      local_508.View_._M_len = (size_t)&DAT_00000006;
      local_508.View_._M_str = "_force";
      cmStrCat<>(&local_548,(cmAlphaNum *)&local_4a8,&local_508);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_348,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      WriteBuild(this,os_00,(cmNinjaBuild *)local_388,0,(bool *)0x0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"restat",(allocator<char> *)&local_508);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_210.Variables,&local_4a8.Comment);
      std::__cxx11::string::assign((char *)pmVar10);
      std::__cxx11::string::~string((string *)&local_4a8);
      psVar9 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar5);
      NinjaOutputPath((string *)&local_508,this,psVar9);
      psVar9 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar5);
      NinjaOutputPath(&local_548,this,psVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"VERIFY_GLOBS",(allocator<char> *)&local_528);
      cmNinjaBuild::cmNinjaBuild(&local_4a8,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::assign((char *)&local_4a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4a8.Outputs,&local_548);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_4a8.ImplicitDeps,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_348);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&local_4a8.Variables._M_t,&local_210.Variables._M_t);
      WriteBuild(this,os_00,&local_4a8,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild(&local_4a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"restat",(allocator<char> *)&local_528);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&local_210.Variables._M_t,&local_4a8.Comment);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,(value_type *)&local_508);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_210.ExplicitDeps,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_508);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_388);
      goto LAB_003428c1;
    }
    bVar7 = this->NinjaSupportsManifestRestat;
  }
  if (((bVar7 & 1) == 0) && (bVar6 = cmake::DoWriteGlobVerifyTarget(pcVar5), bVar6)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
    poVar11 = std::operator<<((ostream *)local_388,"The detected version of Ninja:\n");
    poVar11 = std::operator<<(poVar11,"  ");
    poVar11 = std::operator<<(poVar11,(string *)&this->NinjaVersion);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,
                              "is less than the version of Ninja required by CMake for adding restat dependencies to the build.ninja manifest regeneration target:\n"
                             );
    poVar11 = std::operator<<(poVar11,"  ");
    RequiredNinjaVersionForManifestRestat_abi_cxx11_();
    poVar11 = std::operator<<(poVar11,(string *)&local_4a8);
    std::operator<<(poVar11,"\n");
    std::__cxx11::string::~string((string *)&local_4a8);
    std::operator<<((ostream *)local_388,
                    "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by Ninja."
                   );
    pcVar5 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_508.View_._M_len = 0;
    local_508.View_._M_str = (char *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_508);
    cmake::IssueMessage(pcVar5,AUTHOR_WARNING,&local_4a8.Comment,(cmListFileBacktrace *)&local_508);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_508.View_._M_str);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
  }
LAB_003428c1:
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_210.ImplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_210.ImplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_210.ImplicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_210.ImplicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(this_00,(const_iterator)__first._M_current,
          (const_iterator)
          local_210.ImplicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  WriteBuild(this,os_00,&local_210,0,(bool *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"phony",(allocator<char> *)&local_4a8);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_388,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::assign((char *)local_388);
  std::
  __set_difference<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_210.ImplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_210.ImplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  WriteBuild(this,os_00,(cmNinjaBuild *)local_388,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_388);
  cmNinjaBuild::~cmNinjaBuild(&local_210);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }
  const auto& lg = this->LocalGenerators[0];

  {
    cmNinjaRule rule("RERUN_CMAKE");
    rule.Command =
      cmStrCat(this->CMakeCmd(), " --regenerate-during-build -S",
               lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                         cmOutputConverter::SHELL),
               " -B",
               lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                         cmOutputConverter::SHELL));
    rule.Description = "Re-running CMake...";
    rule.Comment = "Rule for re-running cmake.";
    rule.Generator = true;
    WriteRule(*this->RulesFileStream, rule);
  }

  cmNinjaBuild reBuild("RERUN_CMAKE");
  reBuild.Comment = "Re-run CMake if any of its inputs changed.";
  this->AddRebuildManifestOutputs(reBuild.Outputs);

  for (const auto& localGen : this->LocalGenerators) {
    for (std::string const& fi : localGen->GetMakefile()->GetListFiles()) {
      reBuild.ImplicitDeps.push_back(this->ConvertToNinjaPath(fi));
    }
  }
  reBuild.ImplicitDeps.push_back(this->CMakeCacheFile);

  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if (this->SupportsDirectConsole()) {
    reBuild.Variables["pool"] = "console";
  }

  cmake* cm = this->GetCMakeInstance();
  if (this->SupportsManifestRestat() && cm->DoWriteGlobVerifyTarget()) {
    {
      cmNinjaRule rule("VERIFY_GLOBS");
      rule.Command =
        cmStrCat(this->CMakeCmd(), " -P ",
                 lg->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                           cmOutputConverter::SHELL));
      rule.Description = "Re-checking globbed directories...";
      rule.Comment = "Rule for re-checking globbed directories.";
      rule.Generator = true;
      this->WriteRule(*this->RulesFileStream, rule);
    }

    cmNinjaBuild phonyBuild("phony");
    phonyBuild.Comment = "Phony target to force glob verification run.";
    phonyBuild.Outputs.push_back(
      cmStrCat(cm->GetGlobVerifyScript(), "_force"));
    this->WriteBuild(os, phonyBuild);

    reBuild.Variables["restat"] = "1";
    std::string const verifyScriptFile =
      this->NinjaOutputPath(cm->GetGlobVerifyScript());
    std::string const verifyStampFile =
      this->NinjaOutputPath(cm->GetGlobVerifyStamp());
    {
      cmNinjaBuild vgBuild("VERIFY_GLOBS");
      vgBuild.Comment =
        "Re-run CMake to check if globbed directories changed.";
      vgBuild.Outputs.push_back(verifyStampFile);
      vgBuild.ImplicitDeps = phonyBuild.Outputs;
      vgBuild.Variables = reBuild.Variables;
      this->WriteBuild(os, vgBuild);
    }
    reBuild.Variables.erase("restat");
    reBuild.ImplicitDeps.push_back(verifyScriptFile);
    reBuild.ExplicitDeps.push_back(verifyStampFile);
  } else if (!this->SupportsManifestRestat() &&
             cm->DoWriteGlobVerifyTarget()) {
    std::ostringstream msg;
    msg << "The detected version of Ninja:\n"
        << "  " << this->NinjaVersion << "\n"
        << "is less than the version of Ninja required by CMake for adding "
           "restat dependencies to the build.ninja manifest regeneration "
           "target:\n"
        << "  "
        << cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat()
        << "\n";
    msg << "Any pre-check scripts, such as those generated for file(GLOB "
           "CONFIGURE_DEPENDS), will not be run by Ninja.";
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           msg.str());
  }

  std::sort(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end());
  reBuild.ImplicitDeps.erase(
    std::unique(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end()),
    reBuild.ImplicitDeps.end());

  this->WriteBuild(os, reBuild);

  {
    cmNinjaBuild build("phony");
    build.Comment = "A missing CMake input file is not an error.";
    std::set_difference(std::make_move_iterator(reBuild.ImplicitDeps.begin()),
                        std::make_move_iterator(reBuild.ImplicitDeps.end()),
                        this->CustomCommandOutputs.begin(),
                        this->CustomCommandOutputs.end(),
                        std::back_inserter(build.Outputs));
    this->WriteBuild(os, build);
  }
}